

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_deserialize_set_element
          (t_javame_generator *this,ostream *out,t_set *tset,string *prefix)

{
  t_type *ptVar1;
  ostream *poVar2;
  t_javame_generator *ptVar3;
  string elem;
  t_field felem;
  string sStack_1d8;
  undefined1 local_1b8 [32];
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  t_field local_d8;
  
  std::__cxx11::string::string((string *)&local_f8,"_elem",(allocator *)&local_d8);
  t_generator::tmp((string *)local_1b8,(t_generator *)this,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  ptVar1 = tset->elem_type_;
  std::__cxx11::string::string((string *)(local_1b8 + 0xa0),(string *)local_1b8);
  t_field::t_field(&local_d8,ptVar1,(string *)(local_1b8 + 0xa0));
  std::__cxx11::string::~string((string *)(local_1b8 + 0xa0));
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&sStack_1d8,this,&local_d8,false);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_1d8);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::string::string((string *)(local_1b8 + 0x80),"",(allocator *)&sStack_1d8);
  generate_deserialize_field(this,out,&local_d8,(string *)(local_1b8 + 0x80));
  std::__cxx11::string::~string((string *)(local_1b8 + 0x80));
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,".put(");
  ptVar1 = tset->elem_type_;
  ptVar3 = (t_javame_generator *)local_1b8;
  std::__cxx11::string::string((string *)(local_1b8 + 0x60),(string *)ptVar3);
  box_type(&sStack_1d8,ptVar3,ptVar1,(string *)(local_1b8 + 0x60));
  poVar2 = std::operator<<(poVar2,(string *)&sStack_1d8);
  poVar2 = std::operator<<(poVar2,", ");
  ptVar1 = tset->elem_type_;
  ptVar3 = (t_javame_generator *)local_1b8;
  std::__cxx11::string::string((string *)(local_1b8 + 0x20),(string *)ptVar3);
  box_type((string *)(local_1b8 + 0x40),ptVar3,ptVar1,(string *)(local_1b8 + 0x20));
  poVar2 = std::operator<<(poVar2,(string *)(local_1b8 + 0x40));
  poVar2 = std::operator<<(poVar2,");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_1b8 + 0x40));
  std::__cxx11::string::~string((string *)(local_1b8 + 0x20));
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)(local_1b8 + 0x60));
  t_field::~t_field(&local_d8);
  std::__cxx11::string::~string((string *)local_1b8);
  return;
}

Assistant:

void t_javame_generator::generate_deserialize_set_element(ostream& out,
                                                          t_set* tset,
                                                          string prefix) {
  string elem = tmp("_elem");
  t_field felem(tset->get_elem_type(), elem);

  indent(out) << declare_field(&felem) << endl;

  generate_deserialize_field(out, &felem);

  indent(out) << prefix << ".put(" << box_type(tset->get_elem_type(), elem) << ", "
              << box_type(tset->get_elem_type(), elem) << ");" << endl;
}